

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGPUShader5FmaPrecision.cpp
# Opt level: O2

IterateResult __thiscall
glcts::GPUShader5FmaPrecision<(glcts::INPUT_DATA_TYPE)4>::iterate
          (GPUShader5FmaPrecision<(glcts::INPUT_DATA_TYPE)4> *this)

{
  ostringstream *this_00;
  bool bVar1;
  GLuint roundingMode;
  int iVar2;
  deUint32 dVar3;
  deRoundingMode mode;
  undefined4 extraout_var;
  void *pvVar4;
  GLfloat *pGVar5;
  ulong uVar6;
  GLuint i_1;
  GLfloat *pGVar7;
  GLuint j;
  long lVar8;
  GLfloat *pGVar9;
  char *description;
  int iVar10;
  int iVar11;
  TestContext *this_01;
  GLuint i_2;
  int iVar12;
  GLuint i;
  long lVar13;
  GLfloat *resultsCPU [2];
  undefined1 local_1ab8 [384];
  GLfloat resultCPURTZ [400];
  GLfloat resultCPURNE [400];
  GLfloat resultStd [400];
  GLfloat resultFma [400];
  
  initTest(this);
  iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar13 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar13 + 0x30))(0);
  dVar3 = (**(code **)(lVar13 + 0x800))();
  glu::checkError(dVar3,"glBeginTransformFeedback() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5FmaPrecision.cpp"
                  ,0x112);
  (**(code **)(lVar13 + 0x538))(0,0,100);
  dVar3 = (**(code **)(lVar13 + 0x800))();
  glu::checkError(dVar3,"Rendering failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5FmaPrecision.cpp"
                  ,0x115);
  (**(code **)(lVar13 + 0x638))();
  dVar3 = (**(code **)(lVar13 + 0x800))();
  glu::checkError(dVar3,"glEndTransformFeedback() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5FmaPrecision.cpp"
                  ,0x118);
  (**(code **)(lVar13 + 0x40))(0x8c8e,this->m_vbo_result_fma_id);
  dVar3 = (**(code **)(lVar13 + 0x800))();
  glu::checkError(dVar3,"glBindBuffer() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5FmaPrecision.cpp"
                  ,0x120);
  pvVar4 = (void *)(**(code **)(lVar13 + 0xd00))(0x8c8e,0,0x640,1);
  dVar3 = (**(code **)(lVar13 + 0x800))();
  glu::checkError(dVar3,"Error mapping buffer object\'s data to client space!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5FmaPrecision.cpp"
                  ,0x124);
  memcpy(resultFma,pvVar4,0x640);
  (**(code **)(lVar13 + 0x1670))(0x8c8e);
  dVar3 = (**(code **)(lVar13 + 0x800))();
  glu::checkError(dVar3,"Error unmapping buffer object\'s data!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5FmaPrecision.cpp"
                  ,0x129);
  (**(code **)(lVar13 + 0x40))(0x8c8e,this->m_vbo_result_std_id);
  dVar3 = (**(code **)(lVar13 + 0x800))();
  glu::checkError(dVar3,"glBindBuffer() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5FmaPrecision.cpp"
                  ,300);
  pvVar4 = (void *)(**(code **)(lVar13 + 0xd00))(0x8c8e,0,0x640,1);
  dVar3 = (**(code **)(lVar13 + 0x800))();
  glu::checkError(dVar3,"Error mapping buffer object\'s data to client space!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5FmaPrecision.cpp"
                  ,0x130);
  memcpy(resultStd,pvVar4,0x640);
  (**(code **)(lVar13 + 0x1670))(0x8c8e);
  dVar3 = (**(code **)(lVar13 + 0x800))();
  glu::checkError(dVar3,"Error unmapping buffer object\'s data!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5FmaPrecision.cpp"
                  ,0x135);
  mode = deGetRoundingMode();
  deSetRoundingMode(DE_ROUNDINGMODE_TO_NEAREST_EVEN);
  pGVar9 = this->m_data_c;
  pGVar5 = resultCPURNE;
  pGVar7 = pGVar9;
  for (lVar13 = 0; lVar13 != 100; lVar13 = lVar13 + 1) {
    for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
      pGVar5[lVar8] = pGVar7[lVar8 + -800] * pGVar7[lVar8 + -400] + pGVar7[lVar8];
    }
    pGVar7 = pGVar7 + 4;
    pGVar5 = pGVar5 + 4;
  }
  deSetRoundingMode(DE_ROUNDINGMODE_TO_ZERO);
  pGVar5 = resultCPURTZ;
  for (lVar13 = 0; lVar13 != 100; lVar13 = lVar13 + 1) {
    for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
      pGVar5[lVar8] = pGVar9[lVar8 + -800] * pGVar9[lVar8 + -400] + pGVar9[lVar8];
    }
    pGVar9 = pGVar9 + 4;
    pGVar5 = pGVar5 + 4;
  }
  deSetRoundingMode(mode);
  resultsCPU[0] = resultCPURNE;
  resultsCPU[1] = resultCPURTZ;
  bVar1 = true;
  uVar6 = 0;
  do {
    if ((!bVar1) || (1 < uVar6)) {
      if (!bVar1) {
        this_01 = (this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx;
        description = "Pass";
      }
      else {
        local_1ab8._0_8_ =
             ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        this_00 = (ostringstream *)(local_1ab8 + 8);
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::operator<<((ostream *)this_00,
                        "The values of resultStd[i] & 0xFFFFFFFE and resultFma[i] & 0xFFFFFFFE and resultCPU[i] & 0xFFFFFFFE "
                       );
        std::operator<<((ostream *)this_00,"are not bitwise equal for i = 0..99\n");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1ab8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        this_01 = (this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx;
        description = "Fail";
      }
      tcu::TestContext::setTestResult(this_01,(uint)bVar1,description);
      return STOP;
    }
    pGVar9 = resultsCPU[uVar6];
    bVar1 = true;
    pGVar5 = resultStd;
    pGVar7 = resultFma;
    for (lVar13 = 0; lVar13 != 100; lVar13 = lVar13 + 1) {
      lVar8 = 0;
      while (lVar8 != 4) {
        iVar12 = (int)pGVar9[lVar8] - (int)pGVar7[lVar8];
        iVar2 = -iVar12;
        if (0 < iVar12) {
          iVar2 = iVar12;
        }
        iVar10 = (int)pGVar9[lVar8] - (int)pGVar5[lVar8];
        iVar12 = -iVar10;
        if (0 < iVar10) {
          iVar12 = iVar10;
        }
        iVar11 = (int)pGVar7[lVar8] - (int)pGVar5[lVar8];
        iVar10 = -iVar11;
        if (0 < iVar11) {
          iVar10 = iVar11;
        }
        if (((2 < iVar10) || (2 < iVar2)) || (lVar8 = lVar8 + 1, 2 < iVar12)) goto LAB_00ca6731;
      }
      pGVar9 = pGVar9 + 4;
      pGVar7 = pGVar7 + 4;
      pGVar5 = pGVar5 + 4;
      bVar1 = false;
    }
LAB_00ca6731:
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult GPUShader5FmaPrecision<S>::iterate(void)
{
	initTest();

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Render */
	gl.beginTransformFeedback(GL_POINTS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback() call failed");

	gl.drawArrays(GL_POINTS, 0, m_n_elements);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Rendering failed!");

	gl.endTransformFeedback();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback() call failed");

	/* Retrieve the result data */
	glw::GLfloat		resultFma[m_n_elements * S];
	glw::GLfloat		resultStd[m_n_elements * S];
	const glw::GLfloat* resultTmp = DE_NULL;

	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_vbo_result_fma_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() call failed");

	resultTmp = (const glw::GLfloat*)gl.mapBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, /* offset */
													   m_n_elements * S * sizeof(glw::GLfloat), GL_MAP_READ_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error mapping buffer object's data to client space!");

	memcpy(resultFma, resultTmp, m_n_elements * S * sizeof(glw::GLfloat));

	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error unmapping buffer object's data!");

	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_vbo_result_std_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() call failed");

	resultTmp = (const glw::GLfloat*)gl.mapBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, /* offset */
													   m_n_elements * S * sizeof(glw::GLfloat), GL_MAP_READ_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error mapping buffer object's data to client space!");

	memcpy(resultStd, resultTmp, m_n_elements * S * sizeof(glw::GLfloat));

	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error unmapping buffer object's data!");

	/* Execute the algorithm from shader on CPU */
	glw::GLfloat resultCPURNE[m_n_elements * S];
	glw::GLfloat resultCPURTZ[m_n_elements * S];

	deRoundingMode previousRoundingMode = deGetRoundingMode();

	deSetRoundingMode(DE_ROUNDINGMODE_TO_NEAREST_EVEN);
	for (glw::GLuint i = 0; i < m_n_elements; ++i)
	{
		for (glw::GLuint j = 0; j < S; ++j)
		{
			resultCPURNE[i * S + j] = m_data_a[i * S + j] * m_data_b[i * S + j] + m_data_c[i * S + j];
		}
	}

	deSetRoundingMode(DE_ROUNDINGMODE_TO_ZERO);
	for (glw::GLuint i = 0; i < m_n_elements; ++i)
	{
		for (glw::GLuint j = 0; j < S; ++j)
		{
			resultCPURTZ[i * S + j] = m_data_a[i * S + j] * m_data_b[i * S + j] + m_data_c[i * S + j];
		}
	}

	/* Restore the rounding mode so subsequent tests aren't affected */
	deSetRoundingMode(previousRoundingMode);

	/* Check results */
	const glw::GLfloat* resultsCPU[] = { resultCPURNE, resultCPURTZ };
	FloatConverter		cpuU;
	FloatConverter		fmaU;
	FloatConverter		stdU;
	glw::GLboolean		test_failed = true;

	for (glw::GLuint roundingMode = 0; test_failed && roundingMode < 2; ++roundingMode)
	{
		glw::GLboolean rounding_mode_failed = false;
		for (glw::GLuint i = 0; i < m_n_elements; ++i)
		{
			for (int j = 0; j < S; ++j)
			{
				/* Assign float value to the union */
				cpuU.m_float = resultsCPU[roundingMode][i * S + j];
				fmaU.m_float = resultFma[i * S + j];
				stdU.m_float = resultStd[i * S + j];

				/* Convert float to int bitwise */
				glw::GLint cpuTemp = cpuU.m_int;
				glw::GLint fmaTemp = fmaU.m_int;
				glw::GLint stdTemp = stdU.m_int;

				glw::GLboolean diffCpuFma = de::abs(cpuTemp - fmaTemp) > 2;
				glw::GLboolean diffCpuStd = de::abs(cpuTemp - stdTemp) > 2;
				glw::GLboolean diffFmaStd = de::abs(fmaTemp - stdTemp) > 2;

				if (diffCpuFma || diffCpuStd || diffFmaStd)
				{
					rounding_mode_failed = true;
					break;
				}
			}

			if (rounding_mode_failed)
			{
				break;
			}
			else
			{
				test_failed = false;
			}
		} /* for (all elements) */
	}	 /* for (all rounding modes) */

	if (test_failed)
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "The values of resultStd[i] & 0xFFFFFFFE and resultFma[i] & 0xFFFFFFFE and resultCPU[i] & 0xFFFFFFFE "
			<< "are not bitwise equal for i = 0..99\n"
			<< tcu::TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}

	return STOP;
}